

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O0

void __thiscall Assimp::MDL::HalfLife::HL1MDLLoader::read_sequence_infos(HL1MDLLoader *this)

{
  int current_amount;
  undefined1 auVar1 [16];
  aiString *this_00;
  aiMetadata *this_01;
  bool bVar2;
  aiNode *paVar3;
  ulong uVar4;
  aiNode **ppaVar5;
  reference pvVar6;
  aiString *paVar7;
  reference pvVar8;
  size_type sVar9;
  allocator<char> local_d29;
  string local_d28;
  aiString local_d08;
  allocator<char> local_901;
  string local_900;
  allocator<char> local_8d9;
  string local_8d8;
  allocator<char> local_8b1;
  string local_8b0;
  aiString *local_890;
  aiMetadata *md_2;
  aiNode *pEvent;
  uint j_1;
  aiNode *local_858;
  aiNode *pEventsNode;
  AnimEvent_HL1 *pevent;
  string local_840;
  allocator<char> local_819;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  allocator<char> local_7d1;
  string local_7d0;
  allocator<char> local_7a9;
  string local_7a8;
  allocator<char> local_781;
  string local_780;
  aiString *local_760;
  aiMetadata *md_1;
  aiNode *blend_controller_node;
  uint j;
  aiNode *local_728;
  aiNode *blend_controllers_node;
  int num_blend_controllers;
  allocator<char> local_6f1;
  string local_6f0;
  allocator<char> local_6c9;
  string local_6c8;
  allocator<char> local_6a1;
  string local_6a0;
  aiVector3t<float> local_680;
  allocator<char> local_671;
  string local_670;
  aiVector3t<float> local_650;
  allocator<char> local_641;
  string local_640;
  aiVector3t<float> local_620;
  allocator<char> local_611;
  string local_610;
  allocator<char> local_5e9;
  string local_5e8;
  allocator<char> local_5c1;
  string local_5c0;
  allocator<char> local_599;
  string local_598;
  allocator<char> local_571;
  string local_570;
  allocator<char> local_549;
  string local_548;
  allocator<char> local_521;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  aiString local_4d8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  aiString *local_88;
  aiMetadata *md;
  aiNode *sequence_info_node;
  int i;
  int animation_index;
  vector<aiNode_*,_std::allocator<aiNode_*>_> sequence_info_node_children;
  allocator<char> local_41;
  string local_40;
  aiNode *local_20;
  aiNode *sequence_infos_node;
  SequenceDesc_HL1 *pseqdesc;
  HL1MDLLoader *this_local;
  
  if (this->header_->numseq != 0) {
    sequence_infos_node =
         (aiNode *)((this->header_->super_HalfLifeMDLBaseHeader).ident + this->header_->seqindex);
    pseqdesc = (SequenceDesc_HL1 *)this;
    paVar3 = (aiNode *)operator_new(0x478);
    sequence_info_node_children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"<MDL_sequence_infos>",&local_41);
    aiNode::aiNode(paVar3,&local_40);
    sequence_info_node_children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    local_20 = paVar3;
    std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back(&this->rootnode_children_,&local_20)
    ;
    local_20->mNumChildren = this->header_->numseq;
    auVar1 = ZEXT416(local_20->mNumChildren) * ZEXT816(8);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppaVar5 = (aiNode **)operator_new__(uVar4);
    local_20->mChildren = ppaVar5;
    std::vector<aiNode_*,_std::allocator<aiNode_*>_>::vector
              ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&i);
    sequence_info_node._4_4_ = 0;
    for (sequence_info_node._0_4_ = 0; (int)sequence_info_node < this->header_->numseq;
        sequence_info_node._0_4_ = (int)sequence_info_node + 1) {
      std::vector<aiNode_*,_std::allocator<aiNode_*>_>::clear
                ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&i);
      paVar3 = (aiNode *)operator_new(0x478);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->unique_sequence_names_,(long)(int)sequence_info_node);
      aiNode::aiNode(paVar3,pvVar6);
      local_20->mChildren[(int)sequence_info_node] = paVar3;
      paVar3->mParent = local_20;
      md = (aiMetadata *)paVar3;
      paVar7 = (aiString *)aiMetadata::Alloc(0x10);
      md[0x2f].mKeys = paVar7;
      local_88 = paVar7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"AnimationIndex",&local_a9);
      aiMetadata::Set<int>((aiMetadata *)paVar7,0,&local_a8,(int *)((long)&sequence_info_node + 4));
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
      paVar7 = local_88;
      sequence_info_node._4_4_ =
           sequence_info_node._4_4_ + *(int *)((sequence_infos_node->mName).data + 0x74);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"SequenceGroup",&local_d1);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->unique_sequence_groups_names_,
                            (long)*(int *)((sequence_infos_node->mName).data + 0x98));
      aiString::aiString(&local_4d8,pvVar6);
      aiMetadata::Set<aiString>((aiMetadata *)paVar7,1,&local_d0,&local_4d8);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator(&local_d1);
      paVar7 = local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4f8,"FramesPerSecond",&local_4f9);
      aiMetadata::Set<float>
                ((aiMetadata *)paVar7,2,&local_4f8,
                 (float *)((sequence_infos_node->mName).data + 0x1c));
      std::__cxx11::string::~string((string *)&local_4f8);
      std::allocator<char>::~allocator(&local_4f9);
      paVar7 = local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_520,"NumFrames",&local_521);
      aiMetadata::Set<int>
                ((aiMetadata *)paVar7,3,&local_520,(int *)((sequence_infos_node->mName).data + 0x34)
                );
      std::__cxx11::string::~string((string *)&local_520);
      std::allocator<char>::~allocator(&local_521);
      paVar7 = local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_548,"NumBlends",&local_549);
      aiMetadata::Set<int>
                ((aiMetadata *)paVar7,4,&local_548,(int *)((sequence_infos_node->mName).data + 0x74)
                );
      std::__cxx11::string::~string((string *)&local_548);
      std::allocator<char>::~allocator(&local_549);
      paVar7 = local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"Activity",&local_571)
      ;
      aiMetadata::Set<int>
                ((aiMetadata *)paVar7,5,&local_570,(int *)((sequence_infos_node->mName).data + 0x24)
                );
      std::__cxx11::string::~string((string *)&local_570);
      std::allocator<char>::~allocator(&local_571);
      paVar7 = local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_598,"ActivityWeight",&local_599);
      aiMetadata::Set<int>
                ((aiMetadata *)paVar7,6,&local_598,(int *)((sequence_infos_node->mName).data + 0x28)
                );
      std::__cxx11::string::~string((string *)&local_598);
      std::allocator<char>::~allocator(&local_599);
      paVar7 = local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5c0,"MotionFlags",&local_5c1);
      aiMetadata::Set<int>
                ((aiMetadata *)paVar7,7,&local_5c0,(int *)((sequence_infos_node->mName).data + 0x40)
                );
      std::__cxx11::string::~string((string *)&local_5c0);
      std::allocator<char>::~allocator(&local_5c1);
      paVar7 = local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5e8,"MotionBone",&local_5e9);
      pvVar8 = std::
               vector<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone,_std::allocator<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone>_>
               ::operator[](&this->temp_bones_,
                            (long)*(int *)((sequence_infos_node->mName).data + 0x44));
      aiMetadata::Set<aiString>((aiMetadata *)paVar7,8,&local_5e8,&pvVar8->node->mName);
      std::__cxx11::string::~string((string *)&local_5e8);
      std::allocator<char>::~allocator(&local_5e9);
      paVar7 = local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_610,"LinearMovement",&local_611);
      aiVector3t<float>::aiVector3t
                (&local_620,*(float *)((sequence_infos_node->mName).data + 0x48),
                 *(float *)((sequence_infos_node->mName).data + 0x4c),
                 *(float *)((sequence_infos_node->mName).data + 0x50));
      aiMetadata::Set<aiVector3t<float>>((aiMetadata *)paVar7,9,&local_610,&local_620);
      std::__cxx11::string::~string((string *)&local_610);
      std::allocator<char>::~allocator(&local_611);
      paVar7 = local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_640,"BBMin",&local_641);
      aiVector3t<float>::aiVector3t
                (&local_650,*(float *)((sequence_infos_node->mName).data + 0x5c),
                 *(float *)((sequence_infos_node->mName).data + 0x60),
                 *(float *)((sequence_infos_node->mName).data + 100));
      aiMetadata::Set<aiVector3t<float>>((aiMetadata *)paVar7,10,&local_640,&local_650);
      std::__cxx11::string::~string((string *)&local_640);
      std::allocator<char>::~allocator(&local_641);
      paVar7 = local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_670,"BBMax",&local_671);
      aiVector3t<float>::aiVector3t
                (&local_680,*(float *)((sequence_infos_node->mName).data + 0x68),
                 *(float *)((sequence_infos_node->mName).data + 0x6c),
                 *(float *)((sequence_infos_node->mName).data + 0x70));
      aiMetadata::Set<aiVector3t<float>>((aiMetadata *)paVar7,0xb,&local_670,&local_680);
      std::__cxx11::string::~string((string *)&local_670);
      std::allocator<char>::~allocator(&local_671);
      paVar7 = local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6a0,"EntryNode",&local_6a1);
      aiMetadata::Set<int>
                ((aiMetadata *)paVar7,0xc,&local_6a0,
                 (int *)((sequence_infos_node->mName).data + 0x9c));
      std::__cxx11::string::~string((string *)&local_6a0);
      std::allocator<char>::~allocator(&local_6a1);
      paVar7 = local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c8,"ExitNode",&local_6c9)
      ;
      aiMetadata::Set<int>
                ((aiMetadata *)paVar7,0xd,&local_6c8,
                 (int *)((sequence_infos_node->mName).data + 0xa0));
      std::__cxx11::string::~string((string *)&local_6c8);
      std::allocator<char>::~allocator(&local_6c9);
      paVar7 = local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6f0,"NodeFlags",&local_6f1);
      aiMetadata::Set<int>
                ((aiMetadata *)paVar7,0xe,&local_6f0,
                 (int *)((sequence_infos_node->mName).data + 0xa4));
      std::__cxx11::string::~string((string *)&local_6f0);
      std::allocator<char>::~allocator(&local_6f1);
      paVar7 = local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&num_blend_controllers,"Flags",
                 (allocator<char> *)((long)&blend_controllers_node + 7));
      aiMetadata::Set<int>
                ((aiMetadata *)paVar7,0xf,(string *)&num_blend_controllers,
                 (int *)((sequence_infos_node->mName).data + 0x20));
      std::__cxx11::string::~string((string *)&num_blend_controllers);
      std::allocator<char>::~allocator((allocator<char> *)((long)&blend_controllers_node + 7));
      if ((((this->import_settings_->read_blend_controllers & 1U) != 0) &&
          (bVar2 = get_num_blend_controllers
                             (*(int *)((sequence_infos_node->mName).data + 0x74),
                              (int *)&blend_controllers_node), bVar2)) &&
         ((uint)blend_controllers_node != 0)) {
        paVar3 = (aiNode *)operator_new(0x478);
        blend_controller_node._6_1_ = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&j,"BlendControllers",
                   (allocator<char> *)((long)&blend_controller_node + 7));
        aiNode::aiNode(paVar3,(string *)&j);
        blend_controller_node._6_1_ = 0;
        std::__cxx11::string::~string((string *)&j);
        std::allocator<char>::~allocator((allocator<char> *)((long)&blend_controller_node + 7));
        local_728 = paVar3;
        std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                  ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&i,&local_728);
        local_728->mParent = (aiNode *)md;
        local_728->mNumChildren = (uint)blend_controllers_node;
        ppaVar5 = (aiNode **)operator_new__((ulong)local_728->mNumChildren << 3);
        local_728->mChildren = ppaVar5;
        for (blend_controller_node._0_4_ = 0; (uint)blend_controller_node < local_728->mNumChildren;
            blend_controller_node._0_4_ = (uint)blend_controller_node + 1) {
          paVar3 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(paVar3);
          local_728->mChildren[(uint)blend_controller_node] = paVar3;
          paVar3->mParent = local_728;
          md_1 = (aiMetadata *)paVar3;
          paVar7 = (aiString *)aiMetadata::Alloc(3);
          md_1[0x2f].mKeys = paVar7;
          local_760 = paVar7;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_780,"Start",&local_781);
          aiMetadata::Set<float>
                    ((aiMetadata *)paVar7,0,&local_780,
                     (float *)((sequence_infos_node->mName).data +
                              (ulong)(uint)blend_controller_node * 4 + 0x84));
          std::__cxx11::string::~string((string *)&local_780);
          std::allocator<char>::~allocator(&local_781);
          paVar7 = local_760;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a8,"End",&local_7a9);
          aiMetadata::Set<float>
                    ((aiMetadata *)paVar7,1,&local_7a8,
                     (float *)((sequence_infos_node->mName).data +
                              (ulong)(uint)blend_controller_node * 4 + 0x8c));
          std::__cxx11::string::~string((string *)&local_7a8);
          std::allocator<char>::~allocator(&local_7a9);
          paVar7 = local_760;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7d0,"MotionFlags",&local_7d1);
          aiMetadata::Set<int>
                    ((aiMetadata *)paVar7,2,&local_7d0,
                     (int *)((sequence_infos_node->mName).data +
                            (ulong)(uint)blend_controller_node * 4 + 0x7c));
          std::__cxx11::string::~string((string *)&local_7d0);
          std::allocator<char>::~allocator(&local_7d1);
        }
      }
      paVar3 = sequence_infos_node;
      if (((this->import_settings_->read_animation_events & 1U) != 0) &&
         (*(int *)((sequence_infos_node->mName).data + 0x2c) != 0)) {
        if (0x400 < *(int *)((sequence_infos_node->mName).data + 0x2c)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_818,(char *)paVar3,&local_819);
          std::operator+(&local_7f8,"Sequence ",&local_818);
          current_amount = *(int *)((sequence_infos_node->mName).data + 0x2c);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_840,"animation events",(allocator<char> *)((long)&pevent + 7))
          ;
          log_warning_limit_exceeded<1024>(&local_7f8,current_amount,&local_840);
          std::__cxx11::string::~string((string *)&local_840);
          std::allocator<char>::~allocator((allocator<char> *)((long)&pevent + 7));
          std::__cxx11::string::~string((string *)&local_7f8);
          std::__cxx11::string::~string((string *)&local_818);
          std::allocator<char>::~allocator(&local_819);
        }
        pEventsNode = (aiNode *)
                      ((this->header_->super_HalfLifeMDLBaseHeader).ident +
                      *(int *)((sequence_infos_node->mName).data + 0x30));
        paVar3 = (aiNode *)operator_new(0x478);
        pEvent._6_1_ = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&j_1,"AnimationEvents",(allocator<char> *)((long)&pEvent + 7));
        aiNode::aiNode(paVar3,(string *)&j_1);
        pEvent._6_1_ = 0;
        std::__cxx11::string::~string((string *)&j_1);
        std::allocator<char>::~allocator((allocator<char> *)((long)&pEvent + 7));
        local_858 = paVar3;
        std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                  ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&i,&local_858);
        local_858->mParent = (aiNode *)md;
        local_858->mNumChildren = *(uint *)((sequence_infos_node->mName).data + 0x2c);
        ppaVar5 = (aiNode **)operator_new__((ulong)local_858->mNumChildren << 3);
        local_858->mChildren = ppaVar5;
        for (pEvent._0_4_ = 0; (uint)pEvent < local_858->mNumChildren;
            pEvent._0_4_ = (uint)pEvent + 1) {
          paVar3 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(paVar3);
          local_858->mChildren[(uint)pEvent] = paVar3;
          paVar3->mParent = local_858;
          md_2 = (aiMetadata *)paVar3;
          paVar7 = (aiString *)aiMetadata::Alloc(3);
          md_2[0x2f].mKeys = paVar7;
          local_890 = paVar7;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8b0,"Frame",&local_8b1);
          aiMetadata::Set<int>((aiMetadata *)paVar7,0,&local_8b0,(int *)pEventsNode);
          std::__cxx11::string::~string((string *)&local_8b0);
          std::allocator<char>::~allocator(&local_8b1);
          paVar7 = local_890;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8d8,"ScriptEvent",&local_8d9);
          aiMetadata::Set<int>((aiMetadata *)paVar7,1,&local_8d8,(int *)(pEventsNode->mName).data);
          std::__cxx11::string::~string((string *)&local_8d8);
          std::allocator<char>::~allocator(&local_8d9);
          this_00 = local_890;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_900,"Options",&local_901);
          paVar7 = &pEventsNode->mName;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d28,paVar7->data + 8,&local_d29);
          aiString::aiString(&local_d08,&local_d28);
          aiMetadata::Set<aiString>((aiMetadata *)this_00,2,&local_900,&local_d08);
          std::__cxx11::string::~string((string *)&local_d28);
          std::allocator<char>::~allocator(&local_d29);
          std::__cxx11::string::~string((string *)&local_900);
          std::allocator<char>::~allocator(&local_901);
          pEventsNode = (aiNode *)((pEventsNode->mName).data + 0x48);
        }
      }
      sVar9 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size
                        ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&i);
      this_01 = md;
      if (sVar9 != 0) {
        sVar9 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size
                          ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&i);
        ppaVar5 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::data
                            ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&i);
        aiNode::addChildren((aiNode *)this_01,(uint)sVar9,ppaVar5);
      }
      sequence_infos_node = (aiNode *)((sequence_infos_node->mName).data + 0xac);
    }
    std::vector<aiNode_*,_std::allocator<aiNode_*>_>::~vector
              ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&i);
  }
  return;
}

Assistant:

void HL1MDLLoader::read_sequence_infos() {
    if (!header_->numseq)
        return;

    const SequenceDesc_HL1 *pseqdesc = (const SequenceDesc_HL1 *)((uint8_t *)header_ + header_->seqindex);

    aiNode *sequence_infos_node = new aiNode(AI_MDL_HL1_NODE_SEQUENCE_INFOS);
    rootnode_children_.push_back(sequence_infos_node);

    sequence_infos_node->mNumChildren = static_cast<unsigned int>(header_->numseq);
    sequence_infos_node->mChildren = new aiNode *[sequence_infos_node->mNumChildren];

    std::vector<aiNode *> sequence_info_node_children;

    int animation_index = 0;
    for (int i = 0; i < header_->numseq; ++i, ++pseqdesc) {
        // Clear the list of children for the upcoming sequence info node.
        sequence_info_node_children.clear();

        aiNode *sequence_info_node = sequence_infos_node->mChildren[i] = new aiNode(unique_sequence_names_[i]);
        sequence_info_node->mParent = sequence_infos_node;

        // Setup sequence info node Metadata.
        aiMetadata *md = sequence_info_node->mMetaData = aiMetadata::Alloc(16);
        md->Set(0, "AnimationIndex", animation_index);
        animation_index += pseqdesc->numblends;

        // Reference the sequence group by name. This allows us to search a particular
        // sequence group by name using aiNode(s).
        md->Set(1, "SequenceGroup", aiString(unique_sequence_groups_names_[pseqdesc->seqgroup]));
        md->Set(2, "FramesPerSecond", pseqdesc->fps);
        md->Set(3, "NumFrames", pseqdesc->numframes);
        md->Set(4, "NumBlends", pseqdesc->numblends);
        md->Set(5, "Activity", pseqdesc->activity);
        md->Set(6, "ActivityWeight", pseqdesc->actweight);
        md->Set(7, "MotionFlags", pseqdesc->motiontype);
        md->Set(8, "MotionBone", temp_bones_[pseqdesc->motionbone].node->mName);
        md->Set(9, "LinearMovement", aiVector3D(pseqdesc->linearmovement[0], pseqdesc->linearmovement[1], pseqdesc->linearmovement[2]));
        md->Set(10, "BBMin", aiVector3D(pseqdesc->bbmin[0], pseqdesc->bbmin[1], pseqdesc->bbmin[2]));
        md->Set(11, "BBMax", aiVector3D(pseqdesc->bbmax[0], pseqdesc->bbmax[1], pseqdesc->bbmax[2]));
        md->Set(12, "EntryNode", pseqdesc->entrynode);
        md->Set(13, "ExitNode", pseqdesc->exitnode);
        md->Set(14, "NodeFlags", pseqdesc->nodeflags);
        md->Set(15, "Flags", pseqdesc->flags);

        if (import_settings_.read_blend_controllers) {
            int num_blend_controllers;
            if (get_num_blend_controllers(pseqdesc->numblends, num_blend_controllers) && num_blend_controllers) {
                // Read blend controllers info.
                aiNode *blend_controllers_node = new aiNode(AI_MDL_HL1_NODE_BLEND_CONTROLLERS);
                sequence_info_node_children.push_back(blend_controllers_node);
                blend_controllers_node->mParent = sequence_info_node;
                blend_controllers_node->mNumChildren = static_cast<unsigned int>(num_blend_controllers);
                blend_controllers_node->mChildren = new aiNode *[blend_controllers_node->mNumChildren];

                for (unsigned int j = 0; j < blend_controllers_node->mNumChildren; ++j) {
                    aiNode *blend_controller_node = blend_controllers_node->mChildren[j] = new aiNode();
                    blend_controller_node->mParent = blend_controllers_node;

                    aiMetadata *md = blend_controller_node->mMetaData = aiMetadata::Alloc(3);
                    md->Set(0, "Start", pseqdesc->blendstart[j]);
                    md->Set(1, "End", pseqdesc->blendend[j]);
                    md->Set(2, "MotionFlags", pseqdesc->blendtype[j]);
                }
            }
        }

        if (import_settings_.read_animation_events && pseqdesc->numevents) {
            // Read animation events.

            if (pseqdesc->numevents > AI_MDL_HL1_MAX_EVENTS) {
                log_warning_limit_exceeded<AI_MDL_HL1_MAX_EVENTS>(
                        "Sequence " + std::string(pseqdesc->label),
                        pseqdesc->numevents, "animation events");
            }

            const AnimEvent_HL1 *pevent = (const AnimEvent_HL1 *)((uint8_t *)header_ + pseqdesc->eventindex);

            aiNode *pEventsNode = new aiNode(AI_MDL_HL1_NODE_ANIMATION_EVENTS);
            sequence_info_node_children.push_back(pEventsNode);
            pEventsNode->mParent = sequence_info_node;
            pEventsNode->mNumChildren = static_cast<unsigned int>(pseqdesc->numevents);
            pEventsNode->mChildren = new aiNode *[pEventsNode->mNumChildren];

            for (unsigned int j = 0; j < pEventsNode->mNumChildren; ++j, ++pevent) {
                aiNode *pEvent = pEventsNode->mChildren[j] = new aiNode();
                pEvent->mParent = pEventsNode;

                aiMetadata *md = pEvent->mMetaData = aiMetadata::Alloc(3);
                md->Set(0, "Frame", pevent->frame);
                md->Set(1, "ScriptEvent", pevent->event);
                md->Set(2, "Options", aiString(pevent->options));
            }
        }

        if (sequence_info_node_children.size()) {
            sequence_info_node->addChildren(
                    static_cast<unsigned int>(sequence_info_node_children.size()),
                    sequence_info_node_children.data());
        }
    }
}